

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_AStateProvider_A_GunFlash
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  player_t *this;
  PClass *pPVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  FState *newstate;
  DPSprite *this_00;
  char *pcVar6;
  int pos;
  bool bVar7;
  FName local_38;
  FName local_34;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_0043d3c6:
      pcVar6 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0043d3f1;
    }
    puVar1 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar1 != (undefined8 *)0x0) {
      if (puVar1[1] == 0) {
        uVar4 = (**(code **)*puVar1)(puVar1);
        puVar1[1] = uVar4;
      }
      pPVar5 = (PClass *)puVar1[1];
      bVar7 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar3 && bVar7) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar7 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar3) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if (!bVar7) {
        pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0043d3f1;
      }
    }
    pPVar3 = AStateProvider::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0043d3c6;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar4 = (**(code **)*puVar2)(puVar2);
          puVar2[1] = uVar4;
        }
        pPVar5 = (PClass *)puVar2[1];
        bVar7 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar7) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar7 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
          goto LAB_0043d3f1;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
              pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0043d419:
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                            ,0x561,
                            "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pos = defaultparam->Array[3].field_0.i;
          }
          else {
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar6 = "(param[paramnum]).Type == REGT_INT";
              goto LAB_0043d419;
            }
            pos = param[3].field_0.i;
          }
          if (puVar2[1] == 0) {
            uVar4 = (**(code **)*puVar2)(puVar2);
            puVar2[1] = uVar4;
          }
          newstate = FStateLabelStorage::GetState(&StateLabels,pos,(PClassActor *)puVar2[1],false);
          if (numparam < 5) {
            param = defaultparam->Array;
            if (param[4].field_0.field_3.Type == '\0') goto LAB_0043d335;
            pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[4].field_0.field_3.Type == '\0') {
LAB_0043d335:
              this = (player_t *)puVar1[0x46];
              if (this != (player_t *)0x0) {
                if ((undefined1  [16])((undefined1  [16])param[4].field_0 & (undefined1  [16])0x1)
                    == (undefined1  [16])0x0) {
                  APlayerPawn::PlayAttacking2(this->mo);
                }
                if (newstate == (FState *)0x0) {
                  if (this->ReadyWeapon->bAltFire == true) {
                    local_34.Index = 0xa9;
                    newstate = AActor::FindState((AActor *)this->ReadyWeapon,&local_34);
                  }
                  else {
                    newstate = (FState *)0x0;
                  }
                  if (newstate == (FState *)0x0) {
                    local_38.Index = 0xa8;
                    newstate = AActor::FindState((AActor *)this->ReadyWeapon,&local_38);
                  }
                }
                this_00 = player_t::GetPSprite(this,PSP_FLASH);
                DPSprite::SetState(this_00,newstate,false);
              }
              return 0;
            }
            pcVar6 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                        ,0x562,
                        "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar6 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_0043d3f1;
      }
    }
  }
  pcVar6 = "(paramnum) < numparam";
LAB_0043d3f1:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                ,0x560,
                "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_GunFlash)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_STATE_ACTION_DEF(flash);
	PARAM_INT_DEF(flags);

	player_t *player = self->player;

	if (nullptr == player)
	{
		return 0;
	}
	if (!(flags & GFF_NOEXTCHANGE))
	{
		player->mo->PlayAttacking2 ();
	}
	if (flash == nullptr)
	{
		if (player->ReadyWeapon->bAltFire)
		{
			flash = player->ReadyWeapon->FindState(NAME_AltFlash);
		}
		if (flash == nullptr)
		{
			flash = player->ReadyWeapon->FindState(NAME_Flash);
		}
	}
	P_SetPsprite(player, PSP_FLASH, flash);
	return 0;
}